

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeCodeGenerator.h
# Opt level: O2

InProcCodeGenAllocators * __thiscall
NativeCodeGenerator::CreateAllocators(NativeCodeGenerator *this,PageAllocator *pageAllocator)

{
  AllocationPolicyManager *policyManager;
  ScriptContext *scriptContext;
  ThreadContext *pTVar1;
  HeapAllocator *alloc;
  CodeGenAllocators<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper> *this_00;
  HANDLE processHandle;
  ThreadContextInfo *threadContext;
  undefined1 local_58 [8];
  TrackAllocData data;
  
  local_58 = (undefined1  [8])
             &CodeGenAllocators<Memory::VirtualAllocWrapper,Memory::PreReservedVirtualAllocWrapper>
              ::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_7b1c3b;
  data.filename._0_4_ = 0x88;
  alloc = Memory::HeapAllocator::TrackAllocInfo
                    (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_58);
  this_00 = (CodeGenAllocators<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>
             *)new<Memory::HeapAllocator>(0x460,alloc,0x2f6726);
  policyManager = pageAllocator->policyManager;
  scriptContext = this->scriptContext;
  pTVar1 = scriptContext->threadContext;
  processHandle = GetCurrentProcess();
  threadContext = &pTVar1->super_ThreadContextInfo;
  if (pTVar1 == (ThreadContext *)0x0) {
    threadContext = (ThreadContextInfo *)0x0;
  }
  CodeGenAllocators<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>::
  CodeGenAllocators(this_00,policyManager,scriptContext,threadContext,&pTVar1->codePageAllocators,
                    processHandle);
  return this_00;
}

Assistant:

InProcCodeGenAllocators *CreateAllocators(PageAllocator *const pageAllocator)
    {
        return HeapNew(InProcCodeGenAllocators, pageAllocator->GetAllocationPolicyManager(), scriptContext, scriptContext->GetThreadContext(), scriptContext->GetThreadContext()->GetCodePageAllocators(), GetCurrentProcess());
    }